

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O0

void * startThread(void *entryPtr)

{
  void *arg;
  deThreadFunc func;
  Thread *thread;
  void *entryPtr_local;
  
  (**(code **)((long)entryPtr + 8))(*(undefined8 *)((long)entryPtr + 0x10));
  return (void *)0x0;
}

Assistant:

static void* startThread (void* entryPtr)
{
	Thread*			thread	= (Thread*)entryPtr;
	deThreadFunc	func	= thread->func;
	void*			arg		= thread->arg;

	/* Start actual thread. */
	func(arg);

	return DE_NULL;
}